

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

pair<helics::SmallBuffer,_TimeRepresentation<count_time<9,_long>_>_> * __thiscall
helics::FederateState::getPublishedValue
          (pair<helics::SmallBuffer,_TimeRepresentation<count_time<9,_long>_>_>
           *__return_storage_ptr__,FederateState *this,InterfaceHandle handle)

{
  size_t size;
  SmallBuffer *pSVar1;
  PublicationInfo *pPVar2;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  size_t local_38;
  undefined8 local_30;
  undefined1 *local_28;
  undefined8 local_20;
  
  pPVar2 = InterfaceInfo::getPublication(&this->interfaceInformation,handle);
  if (pPVar2 == (PublicationInfo *)0x0) {
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_38 = 0;
    local_30 = 0x40;
    local_20 = 0;
    (__return_storage_ptr__->first).bufferSize = 0;
    pSVar1 = &__return_storage_ptr__->first;
    (pSVar1->buffer)._M_elems[0x30] = 0;
    (pSVar1->buffer)._M_elems[0x31] = 0;
    (pSVar1->buffer)._M_elems[0x32] = 0;
    (pSVar1->buffer)._M_elems[0x33] = 0;
    (pSVar1->buffer)._M_elems[0x34] = 0;
    (pSVar1->buffer)._M_elems[0x35] = 0;
    (pSVar1->buffer)._M_elems[0x36] = 0;
    (pSVar1->buffer)._M_elems[0x37] = 0;
    pSVar1 = &__return_storage_ptr__->first;
    (pSVar1->buffer)._M_elems[0x38] = 0;
    (pSVar1->buffer)._M_elems[0x39] = 0;
    (pSVar1->buffer)._M_elems[0x3a] = 0;
    (pSVar1->buffer)._M_elems[0x3b] = 0;
    (pSVar1->buffer)._M_elems[0x3c] = 0;
    (pSVar1->buffer)._M_elems[0x3d] = 0;
    (pSVar1->buffer)._M_elems[0x3e] = 0;
    (pSVar1->buffer)._M_elems[0x3f] = 0;
    pSVar1 = &__return_storage_ptr__->first;
    (pSVar1->buffer)._M_elems[0x20] = 0;
    (pSVar1->buffer)._M_elems[0x21] = 0;
    (pSVar1->buffer)._M_elems[0x22] = 0;
    (pSVar1->buffer)._M_elems[0x23] = 0;
    (pSVar1->buffer)._M_elems[0x24] = 0;
    (pSVar1->buffer)._M_elems[0x25] = 0;
    (pSVar1->buffer)._M_elems[0x26] = 0;
    (pSVar1->buffer)._M_elems[0x27] = 0;
    pSVar1 = &__return_storage_ptr__->first;
    (pSVar1->buffer)._M_elems[0x28] = 0;
    (pSVar1->buffer)._M_elems[0x29] = 0;
    (pSVar1->buffer)._M_elems[0x2a] = 0;
    (pSVar1->buffer)._M_elems[0x2b] = 0;
    (pSVar1->buffer)._M_elems[0x2c] = 0;
    (pSVar1->buffer)._M_elems[0x2d] = 0;
    (pSVar1->buffer)._M_elems[0x2e] = 0;
    (pSVar1->buffer)._M_elems[0x2f] = 0;
    pSVar1 = &__return_storage_ptr__->first;
    (pSVar1->buffer)._M_elems[0x10] = 0;
    (pSVar1->buffer)._M_elems[0x11] = 0;
    (pSVar1->buffer)._M_elems[0x12] = 0;
    (pSVar1->buffer)._M_elems[0x13] = 0;
    (pSVar1->buffer)._M_elems[0x14] = 0;
    (pSVar1->buffer)._M_elems[0x15] = 0;
    (pSVar1->buffer)._M_elems[0x16] = 0;
    (pSVar1->buffer)._M_elems[0x17] = 0;
    pSVar1 = &__return_storage_ptr__->first;
    (pSVar1->buffer)._M_elems[0x18] = 0;
    (pSVar1->buffer)._M_elems[0x19] = 0;
    (pSVar1->buffer)._M_elems[0x1a] = 0;
    (pSVar1->buffer)._M_elems[0x1b] = 0;
    (pSVar1->buffer)._M_elems[0x1c] = 0;
    (pSVar1->buffer)._M_elems[0x1d] = 0;
    (pSVar1->buffer)._M_elems[0x1e] = 0;
    (pSVar1->buffer)._M_elems[0x1f] = 0;
    (__return_storage_ptr__->first).buffer._M_elems[0] = 0;
    (__return_storage_ptr__->first).buffer._M_elems[1] = 0;
    (__return_storage_ptr__->first).buffer._M_elems[2] = 0;
    (__return_storage_ptr__->first).buffer._M_elems[3] = 0;
    (__return_storage_ptr__->first).buffer._M_elems[4] = 0;
    (__return_storage_ptr__->first).buffer._M_elems[5] = 0;
    (__return_storage_ptr__->first).buffer._M_elems[6] = 0;
    (__return_storage_ptr__->first).buffer._M_elems[7] = 0;
    pSVar1 = &__return_storage_ptr__->first;
    (pSVar1->buffer)._M_elems[8] = 0;
    (pSVar1->buffer)._M_elems[9] = 0;
    (pSVar1->buffer)._M_elems[10] = 0;
    (pSVar1->buffer)._M_elems[0xb] = 0;
    (pSVar1->buffer)._M_elems[0xc] = 0;
    (pSVar1->buffer)._M_elems[0xd] = 0;
    (pSVar1->buffer)._M_elems[0xe] = 0;
    (pSVar1->buffer)._M_elems[0xf] = 0;
    (__return_storage_ptr__->first).bufferCapacity = 0x40;
    (__return_storage_ptr__->first).nonOwning = false;
    (__return_storage_ptr__->first).locked = false;
    (__return_storage_ptr__->first).usingAllocatedBuffer = false;
    (__return_storage_ptr__->first).errorCondition = '\0';
    (__return_storage_ptr__->first).userKey = 0;
    local_28 = (undefined1 *)&local_78;
    memcpy(__return_storage_ptr__,&local_78,0);
    (__return_storage_ptr__->first).heap = (byte *)__return_storage_ptr__;
    (__return_storage_ptr__->first).bufferSize = local_38;
    local_30 = 0x40;
    local_38 = 0;
    (__return_storage_ptr__->second).internalTimeCode = -0x7fffffffffffffff;
    if ((local_20._2_1_ == '\x01') && ((char)local_20 == '\0')) {
      local_28 = (undefined1 *)&local_78;
      operator_delete__(&local_78);
    }
  }
  else {
    pSVar1 = &__return_storage_ptr__->first;
    (pSVar1->buffer)._M_elems[0x30] = 0;
    (pSVar1->buffer)._M_elems[0x31] = 0;
    (pSVar1->buffer)._M_elems[0x32] = 0;
    (pSVar1->buffer)._M_elems[0x33] = 0;
    (pSVar1->buffer)._M_elems[0x34] = 0;
    (pSVar1->buffer)._M_elems[0x35] = 0;
    (pSVar1->buffer)._M_elems[0x36] = 0;
    (pSVar1->buffer)._M_elems[0x37] = 0;
    pSVar1 = &__return_storage_ptr__->first;
    (pSVar1->buffer)._M_elems[0x38] = 0;
    (pSVar1->buffer)._M_elems[0x39] = 0;
    (pSVar1->buffer)._M_elems[0x3a] = 0;
    (pSVar1->buffer)._M_elems[0x3b] = 0;
    (pSVar1->buffer)._M_elems[0x3c] = 0;
    (pSVar1->buffer)._M_elems[0x3d] = 0;
    (pSVar1->buffer)._M_elems[0x3e] = 0;
    (pSVar1->buffer)._M_elems[0x3f] = 0;
    pSVar1 = &__return_storage_ptr__->first;
    (pSVar1->buffer)._M_elems[0x20] = 0;
    (pSVar1->buffer)._M_elems[0x21] = 0;
    (pSVar1->buffer)._M_elems[0x22] = 0;
    (pSVar1->buffer)._M_elems[0x23] = 0;
    (pSVar1->buffer)._M_elems[0x24] = 0;
    (pSVar1->buffer)._M_elems[0x25] = 0;
    (pSVar1->buffer)._M_elems[0x26] = 0;
    (pSVar1->buffer)._M_elems[0x27] = 0;
    pSVar1 = &__return_storage_ptr__->first;
    (pSVar1->buffer)._M_elems[0x28] = 0;
    (pSVar1->buffer)._M_elems[0x29] = 0;
    (pSVar1->buffer)._M_elems[0x2a] = 0;
    (pSVar1->buffer)._M_elems[0x2b] = 0;
    (pSVar1->buffer)._M_elems[0x2c] = 0;
    (pSVar1->buffer)._M_elems[0x2d] = 0;
    (pSVar1->buffer)._M_elems[0x2e] = 0;
    (pSVar1->buffer)._M_elems[0x2f] = 0;
    pSVar1 = &__return_storage_ptr__->first;
    (pSVar1->buffer)._M_elems[0x10] = 0;
    (pSVar1->buffer)._M_elems[0x11] = 0;
    (pSVar1->buffer)._M_elems[0x12] = 0;
    (pSVar1->buffer)._M_elems[0x13] = 0;
    (pSVar1->buffer)._M_elems[0x14] = 0;
    (pSVar1->buffer)._M_elems[0x15] = 0;
    (pSVar1->buffer)._M_elems[0x16] = 0;
    (pSVar1->buffer)._M_elems[0x17] = 0;
    pSVar1 = &__return_storage_ptr__->first;
    (pSVar1->buffer)._M_elems[0x18] = 0;
    (pSVar1->buffer)._M_elems[0x19] = 0;
    (pSVar1->buffer)._M_elems[0x1a] = 0;
    (pSVar1->buffer)._M_elems[0x1b] = 0;
    (pSVar1->buffer)._M_elems[0x1c] = 0;
    (pSVar1->buffer)._M_elems[0x1d] = 0;
    (pSVar1->buffer)._M_elems[0x1e] = 0;
    (pSVar1->buffer)._M_elems[0x1f] = 0;
    (__return_storage_ptr__->first).buffer._M_elems[0] = 0;
    (__return_storage_ptr__->first).buffer._M_elems[1] = 0;
    (__return_storage_ptr__->first).buffer._M_elems[2] = 0;
    (__return_storage_ptr__->first).buffer._M_elems[3] = 0;
    (__return_storage_ptr__->first).buffer._M_elems[4] = 0;
    (__return_storage_ptr__->first).buffer._M_elems[5] = 0;
    (__return_storage_ptr__->first).buffer._M_elems[6] = 0;
    (__return_storage_ptr__->first).buffer._M_elems[7] = 0;
    pSVar1 = &__return_storage_ptr__->first;
    (pSVar1->buffer)._M_elems[8] = 0;
    (pSVar1->buffer)._M_elems[9] = 0;
    (pSVar1->buffer)._M_elems[10] = 0;
    (pSVar1->buffer)._M_elems[0xb] = 0;
    (pSVar1->buffer)._M_elems[0xc] = 0;
    (pSVar1->buffer)._M_elems[0xd] = 0;
    (pSVar1->buffer)._M_elems[0xe] = 0;
    (pSVar1->buffer)._M_elems[0xf] = 0;
    (__return_storage_ptr__->first).bufferSize = 0;
    (__return_storage_ptr__->first).bufferCapacity = 0x40;
    (__return_storage_ptr__->first).heap = (byte *)__return_storage_ptr__;
    (__return_storage_ptr__->first).nonOwning = false;
    (__return_storage_ptr__->first).locked = false;
    (__return_storage_ptr__->first).usingAllocatedBuffer = false;
    (__return_storage_ptr__->first).errorCondition = '\0';
    (__return_storage_ptr__->first).userKey = 0;
    size = (pPVar2->data).bufferSize;
    SmallBuffer::reserve(&__return_storage_ptr__->first,size);
    (__return_storage_ptr__->first).bufferSize = size;
    memcpy((__return_storage_ptr__->first).heap,(pPVar2->data).heap,(pPVar2->data).bufferSize);
    (__return_storage_ptr__->second).internalTimeCode = (pPVar2->lastPublishTime).internalTimeCode;
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<SmallBuffer, Time> FederateState::getPublishedValue(InterfaceHandle handle)
{
    auto* pub = interfaces().getPublication(handle);
    if (pub != nullptr) {
        return {pub->data, pub->lastPublishTime};
    }
    return {SmallBuffer{}, Time::minVal()};
}